

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O1

void __thiscall BmsParser::Parser::WriteLogLine(Parser *this,char *t,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  char buf [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [16];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1032];
  
  local_4e8 = local_4d8;
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_4f0 = &vl[0].overflow_arg_area;
  local_4f8 = 0x3000000010;
  local_4c8 = in_RDX;
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  memset(local_428,0,0x400);
  vsprintf(local_428,t,&local_4f8);
  sVar1 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->log_,local_428,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->log_,"\n",1);
  return;
}

Assistant:

void Parser::WriteLogLine(const char* t, ...) {
		va_list vl;
		va_start(vl, t);
		char buf[1024] = { 0, };
		vsprintf_s(buf, t, vl);
		log_ << buf << "\n";
#ifdef _DEBUG
		printf("%s\n", buf);
#endif
	}